

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::TryCatchStatement(SQCompiler *this)

{
  SQScope *pSVar1;
  SQInteger *pSVar2;
  long *plVar3;
  SQFuncState *pSVar4;
  SQUnsignedInteger SVar5;
  long lVar6;
  long lVar7;
  SQUnsignedInteger SVar8;
  SQInteger SVar9;
  SQObject SVar10;
  SQScope __oldscope__;
  SQScope __oldscope___1;
  SQObject local_68;
  long local_50;
  SQInstruction local_48;
  SQInteger SStack_40;
  SQInstruction local_38;
  
  SVar9 = SQLexer::Lex(&this->_lex);
  this->_token = SVar9;
  local_68._type = 0;
  local_68._4_4_ = 0x37;
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_68);
  pSVar4 = this->_fs;
  pSVar4->_traps = pSVar4->_traps + 1;
  SVar5 = (pSVar4->_breaktargets)._size;
  if (SVar5 != 0) {
    plVar3 = (pSVar4->_breaktargets)._vals + (SVar5 - 1);
    *plVar3 = *plVar3 + 1;
  }
  SVar5 = (pSVar4->_continuetargets)._size;
  if (SVar5 != 0) {
    plVar3 = (pSVar4->_continuetargets)._vals + (SVar5 - 1);
    *plVar3 = *plVar3 + 1;
  }
  SVar5 = (pSVar4->_instructions)._size;
  pSVar1 = &this->_scope;
  local_68._0_8_ = (this->_scope).outers;
  local_68._unVal = (SQObjectValue)(this->_scope).stacksize;
  (this->_scope).outers = pSVar4->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar4);
  (this->_scope).stacksize = SVar9;
  Statement(this,true);
  lVar6 = this->_fs->_outers;
  SVar9 = SQFuncState::GetStackSize(this->_fs);
  lVar7 = (this->_scope).stacksize;
  if (SVar9 != lVar7) {
    SQFuncState::SetStackSize(this->_fs,lVar7);
    if (lVar6 != this->_fs->_outers) {
      local_48.op = '<';
      local_48._arg0 = '\0';
      local_48._arg2 = '\0';
      local_48._arg3 = '\0';
      local_48._arg1 = (SQInt32)(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,&local_48);
    }
  }
  pSVar1->outers = local_68._0_8_;
  (this->_scope).stacksize = (SQInteger)local_68._unVal;
  pSVar4 = this->_fs;
  pSVar2 = &pSVar4->_traps;
  *pSVar2 = *pSVar2 + -1;
  local_68._type = 0;
  local_68._4_4_ = 0x138;
  SQFuncState::AddInstruction(pSVar4,(SQInstruction *)&local_68);
  pSVar4 = this->_fs;
  SVar8 = (pSVar4->_breaktargets)._size;
  if (SVar8 != 0) {
    plVar3 = (pSVar4->_breaktargets)._vals + (SVar8 - 1);
    *plVar3 = *plVar3 + -1;
  }
  lVar6 = SVar5 - 1;
  SVar8 = (pSVar4->_continuetargets)._size;
  if (SVar8 != 0) {
    plVar3 = (pSVar4->_continuetargets)._vals + (SVar8 - 1);
    *plVar3 = *plVar3 + -1;
  }
  local_68._type = 0;
  local_68._4_4_ = 0x1c;
  SQFuncState::AddInstruction(pSVar4,(SQInstruction *)&local_68);
  SVar8 = (this->_fs->_instructions)._size;
  local_50 = SVar8 - 1;
  SQFuncState::SetInstructionParam(this->_fs,lVar6,1,SVar8 - SVar5);
  Expect(this,0x126);
  Expect(this,0x28);
  SVar10 = Expect(this,0x102);
  local_68._unVal = SVar10._unVal;
  local_68._type = SVar10._type;
  Expect(this,0x29);
  local_48 = (SQInstruction)pSVar1->outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar4 = this->_fs;
  (this->_scope).outers = pSVar4->_outers;
  SVar9 = SQFuncState::GetStackSize(pSVar4);
  (this->_scope).stacksize = SVar9;
  SVar9 = SQFuncState::PushLocalVariable(this->_fs,&local_68);
  SQFuncState::SetInstructionParam(this->_fs,lVar6,0,SVar9);
  Statement(this,true);
  SQFuncState::SetInstructionParams
            (this->_fs,local_50,0,(this->_fs->_instructions)._size - SVar8,0,0);
  lVar6 = this->_fs->_outers;
  SVar9 = SQFuncState::GetStackSize(this->_fs);
  lVar7 = (this->_scope).stacksize;
  if (SVar9 != lVar7) {
    SQFuncState::SetStackSize(this->_fs,lVar7);
    if (lVar6 != this->_fs->_outers) {
      local_38._arg1 = (SQInt32)(this->_scope).stacksize;
      local_38.op = '<';
      local_38._arg0 = '\0';
      local_38._arg2 = '\0';
      local_38._arg3 = '\0';
      SQFuncState::AddInstruction(this->_fs,&local_38);
    }
  }
  pSVar1->outers = (SQInteger)local_48;
  (this->_scope).stacksize = SStack_40;
  return;
}

Assistant:

void TryCatchStatement()
    {
        SQObject exid;
        Lex();
        _fs->AddInstruction(_OP_PUSHTRAP,0,0);
        _fs->_traps++;
        if(_fs->_breaktargets.size()) _fs->_breaktargets.top()++;
        if(_fs->_continuetargets.size()) _fs->_continuetargets.top()++;
        SQInteger trappos = _fs->GetCurrentPos();
        {
            BEGIN_SCOPE();
            Statement();
            END_SCOPE();
        }
        _fs->_traps--;
        _fs->AddInstruction(_OP_POPTRAP, 1, 0);
        if(_fs->_breaktargets.size()) _fs->_breaktargets.top()--;
        if(_fs->_continuetargets.size()) _fs->_continuetargets.top()--;
        _fs->AddInstruction(_OP_JMP, 0, 0);
        SQInteger jmppos = _fs->GetCurrentPos();
        _fs->SetInstructionParam(trappos, 1, (_fs->GetCurrentPos() - trappos));
        Expect(TK_CATCH); Expect(_SC('(')); exid = Expect(TK_IDENTIFIER); Expect(_SC(')'));
        {
            BEGIN_SCOPE();
            SQInteger ex_target = _fs->PushLocalVariable(exid);
            _fs->SetInstructionParam(trappos, 0, ex_target);
            Statement();
            _fs->SetInstructionParams(jmppos, 0, (_fs->GetCurrentPos() - jmppos), 0);
            END_SCOPE();
        }
    }